

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::mouseMoveEvent(QTextEdit *this,QMouseEvent *e)

{
  bool bVar1;
  QFlagsStorage<Qt::MouseButton> msec;
  int iVar2;
  QTextEditPrivate *this_00;
  ulong uVar3;
  QObject *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QTextEditPrivate *d;
  QRect visible;
  QPoint pos;
  MouseButton other;
  QPointF *this_01;
  QEvent *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::MouseButton> in_stack_ffffffffffffffdc;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QTextEdit *)0x6d3d8e);
  other = (MouseButton)((ulong)in_RDI >> 0x20);
  this_00->field_0x320 = this_00->field_0x320 & 0xf7;
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QSinglePointEvent::position((QSinglePointEvent *)0x6d3dc0);
  local_10 = QPointF::toPoint(this_01);
  QTextEditPrivate::sendControlEvent
            ((QTextEditPrivate *)CONCAT44(in_stack_ffffffffffffffdc.i,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffc8);
  QSinglePointEvent::buttons((QSinglePointEvent *)this_00);
  msec.i = (Int)QFlags<Qt::MouseButton>::operator&((QFlags<Qt::MouseButton> *)this_00,other);
  bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&stack0xffffffffffffffdc);
  if ((!bVar1) && (iVar2 = QMouseEvent::source(), iVar2 == 0)) {
    QWidget::rect((QWidget *)&DAT_aaaaaaaaaaaaaaaa);
    uVar3 = QRect::contains((QPoint *)&stack0xffffffffffffffc8,SUB81(&local_10,0));
    if ((uVar3 & 1) == 0) {
      bVar1 = QBasicTimer::isActive(&this_00->autoScrollTimer);
      if (!bVar1) {
        QBasicTimer::start((QBasicTimer *)this_01,msec.i,in_RSI);
      }
    }
    else {
      QBasicTimer::stop();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->inDrag = false; // paranoia
    const QPoint pos = e->position().toPoint();
    d->sendControlEvent(e);
    if (!(e->buttons() & Qt::LeftButton))
        return;
    if (e->source() == Qt::MouseEventNotSynthesized) {
        const QRect visible = d->viewport->rect();
        if (visible.contains(pos))
            d->autoScrollTimer.stop();
        else if (!d->autoScrollTimer.isActive())
            d->autoScrollTimer.start(100, this);
    }
}